

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

void anon_unknown.dwarf_23886::gen2(Value **L,Value **R,int *Budget,int Width)

{
  bool bVar1;
  uint uVar2;
  Value *pVVar3;
  undefined1 local_31;
  Value *T;
  int Width_local;
  int *Budget_local;
  Value **R_local;
  Value **L_local;
  
  pVVar3 = genVal(Budget,Width,true,true);
  *L = pVVar3;
  bVar1 = llvm::isa<llvm::Constant,llvm::Value*>(L);
  local_31 = 0;
  if (!bVar1) {
    bVar1 = llvm::isa<llvm::UndefValue,llvm::Value*>(L);
    local_31 = bVar1 ^ 0xff;
  }
  pVVar3 = genVal(Budget,Width,(bool)(local_31 & 1),true);
  *R = pVVar3;
  uVar2 = rand();
  if ((uVar2 & 1) == 0) {
    pVVar3 = *L;
    *L = *R;
    *R = pVVar3;
  }
  return;
}

Assistant:

void gen2(Value *&L, Value *&R, int &Budget, int Width) {
  L = genVal(Budget, Width, true);
  R = genVal(Budget, Width, !isa<Constant>(L) && !isa<UndefValue>(L));
  if ((rand() & 1) == 0) {
    Value *T = L;
    L = R;
    R = T;
  }
}